

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

void tnt_schema_index_free(mh_assoc_t *schema)

{
  tnt_schema_ival *val;
  mh_int_t mVar1;
  assoc_val **ppaVar2;
  uint local_78;
  mh_int_t n;
  assoc_key key_string;
  undefined1 local_58 [8];
  assoc_key key_number;
  assoc_val *av2;
  assoc_val *av1;
  tnt_schema_ival *ival;
  uint local_1c;
  mh_int_t i;
  mh_int_t index_slot;
  mh_int_t pos;
  mh_assoc_t *schema_local;
  
  local_1c = 0;
  while ((local_1c < schema->n_buckets &&
         ((schema->b[local_1c >> 4] & 1 << ((byte)local_1c & 0xf)) == 0))) {
    local_1c = local_1c + 1;
  }
  i = local_1c;
  do {
    if (schema->n_buckets <= i) {
      return;
    }
    ppaVar2 = mh_assoc_node(schema,i);
    val = (tnt_schema_ival *)(*ppaVar2)->data;
    av2 = (assoc_val *)0x0;
    key_number.id_len = 0;
    key_number._12_4_ = 0;
    local_58 = (undefined1  [8])&val->number;
    key_number.id._0_4_ = 4;
    mVar1 = mh_assoc_find(schema,(assoc_key *)local_58,(void *)0x0);
    key_string._12_4_ = schema->n_buckets;
    if (mVar1 != key_string._12_4_) {
      ppaVar2 = mh_assoc_node(schema,mVar1);
      av2 = *ppaVar2;
      mh_assoc_del(schema,mVar1,(void *)0x0);
    }
    _n = val->name;
    key_string.id._0_4_ = val->name_len;
    mVar1 = mh_assoc_find(schema,(assoc_key *)&n,(void *)0x0);
    if (mVar1 != schema->n_buckets) {
      ppaVar2 = mh_assoc_node(schema,mVar1);
      key_number._8_8_ = *ppaVar2;
      mh_assoc_del(schema,mVar1,(void *)0x0);
    }
    tnt_schema_ival_free(val);
    if (av2 != (assoc_val *)0x0) {
      tnt_mem_free(av2);
    }
    if (key_number._8_8_ != 0) {
      tnt_mem_free((void *)key_number._8_8_);
    }
    local_78 = i;
    if (i < schema->n_buckets) {
      do {
        local_78 = i + 1;
        if (schema->n_buckets <= local_78) break;
        i = local_78;
      } while ((schema->b[local_78 >> 4] & 1 << ((byte)local_78 & 0xf)) == 0);
    }
    i = local_78;
  } while( true );
}

Assistant:

static inline void
tnt_schema_index_free(struct mh_assoc_t *schema) {
	mh_int_t pos = 0;
	mh_int_t index_slot = 0;
	mh_foreach(schema, pos) {
		struct tnt_schema_ival *ival =
			(*mh_assoc_node(schema, pos))->data;
		struct assoc_val *av1 = NULL, *av2 = NULL;
		do {
			struct assoc_key key_number = {
				(void *)&(ival->number),
				sizeof(uint32_t)
			};
			index_slot = mh_assoc_find(schema, &key_number, NULL);
			if (index_slot == mh_end(schema))
				break;
			av1 = *mh_assoc_node(schema, index_slot);
			mh_assoc_del(schema, index_slot, NULL);
		} while (0);
		do {
			struct assoc_key key_string = {
				ival->name,
				ival->name_len
			};
			index_slot = mh_assoc_find(schema, &key_string, NULL);
			if (index_slot == mh_end(schema))
				break;
			av2 = *mh_assoc_node(schema, index_slot);
			mh_assoc_del(schema, index_slot, NULL);
		} while (0);
		tnt_schema_ival_free(ival);
		if (av1) tnt_mem_free((void *)av1);
		if (av2) tnt_mem_free((void *)av2);
	}
}